

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O2

string_t __thiscall
duckdb::HugeintCastToVarInt::Operation<duckdb::uhugeint_t>
          (HugeintCastToVarInt *this,uhugeint_t int_value,Vector *result)

{
  long lVar1;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t len;
  ulong uVar2;
  ulong uVar3;
  unsigned_long __x;
  HugeintCastToVarInt *__x_00;
  char *blob_00;
  char **ppcVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  __type_conflict8 _Var9;
  double dVar10;
  string_t blob;
  
  uVar3 = int_value.lower;
  __x = uVar3;
  if (uVar3 == 0xffffffffffffffff) {
LAB_006b5912:
    _Var9 = ::std::log2<unsigned_long>(__x);
    dVar10 = ceil(_Var9 * 0.125);
    uVar5 = (ulong)dVar10;
    if ((int)uVar5 != 0) {
      iVar6 = (int)uVar5 + 8;
      len = extraout_RDX;
      goto LAB_006b595d;
    }
  }
  else if (uVar3 != 0) {
    __x = uVar3 + 1;
    goto LAB_006b5912;
  }
  if (this == (HugeintCastToVarInt *)0xffffffffffffffff) {
    __x_00 = (HugeintCastToVarInt *)0xffffffffffffffff;
  }
  else {
    __x_00 = this + 1;
  }
  _Var9 = ::std::log2<unsigned_long>((unsigned_long)__x_00);
  dVar10 = ceil(_Var9 * 0.125);
  iVar6 = (int)(long)dVar10;
  uVar5 = 0;
  len = extraout_RDX_00;
LAB_006b595d:
  uVar7 = iVar6 + (uint)(iVar6 == 0);
  blob = StringVector::EmptyString((StringVector *)int_value.upper,(Vector *)(ulong)(uVar7 + 3),len)
  ;
  blob_00 = blob.value._8_8_;
  if (blob.value._0_4_ < 0xd) {
    blob_00 = blob.value.pointer.prefix;
  }
  Varint::SetHeader(blob_00,(ulong)uVar7,false);
  ppcVar4 = (char **)(blob_00 + 3);
  lVar1 = (uVar5 & 0xffffffff) * 8;
  uVar2 = uVar5 & 0xffffffff;
  while( true ) {
    lVar1 = lVar1 + -8;
    if ((int)uVar2 < 1) break;
    *(char *)ppcVar4 = (char)(uVar3 >> ((byte)lVar1 & 0x3f));
    ppcVar4 = (char **)((long)ppcVar4 + 1);
    uVar2 = (ulong)((int)uVar2 - 1);
  }
  iVar8 = uVar7 + ~(uint)uVar5;
  iVar6 = iVar8 * 8;
  for (; -1 < iVar8; iVar8 = iVar8 + -1) {
    *(char *)ppcVar4 = (char)((ulong)this >> ((byte)iVar6 & 0x3f));
    ppcVar4 = (char **)((long)ppcVar4 + 1);
    iVar6 = iVar6 + -8;
  }
  string_t::Finalize(&blob);
  return (string_t)blob.value;
}

Assistant:

string_t HugeintCastToVarInt::Operation(uhugeint_t int_value, Vector &result) {
	uint32_t data_byte_size;
	if (int_value.upper != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size =
		    (int_value.upper == 0) ? 0 : static_cast<uint32_t>(std::ceil(std::log2(int_value.upper + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(int_value.upper) / 8.0));
	}

	uint32_t upper_byte_size = data_byte_size;
	if (data_byte_size > 0) {
		// If we have at least one byte on the upper side, the bottom side is complete
		data_byte_size += 8;
	} else {
		if (int_value.lower != NumericLimits<uint64_t>::Maximum()) {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower + 1) / 8.0));
		} else {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower) / 8.0));
		}
	}
	if (data_byte_size == 0) {
		data_byte_size++;
	}
	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, false);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(upper_byte_size) - 1; i >= 0; --i) {
		writable_blob[wb_idx++] = static_cast<char>(int_value.upper >> i * 8 & 0xFF);
	}
	for (int i = static_cast<int>(data_byte_size - upper_byte_size) - 1; i >= 0; --i) {
		writable_blob[wb_idx++] = static_cast<char>(int_value.lower >> i * 8 & 0xFF);
	}
	blob.Finalize();
	return blob;
}